

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

string * testing::PrintToString<cfd::core::DescriptorKeyType>(DescriptorKeyType *value)

{
  string *in_RDI;
  stringstream ss;
  string *value_00;
  stringstream local_198 [408];
  
  value_00 = in_RDI;
  std::__cxx11::stringstream::stringstream(local_198);
  internal::UniversalTersePrinter<cfd::core::DescriptorKeyType>::Print
            ((DescriptorKeyType *)value_00,(ostream *)in_RDI);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return value_00;
}

Assistant:

::std::string PrintToString(const T& value) {
  ::std::stringstream ss;
  internal::UniversalTersePrinter<T>::Print(value, &ss);
  return ss.str();
}